

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hh
# Opt level: O2

const_dbl_view __thiscall Matrix::get_values(Matrix *this,int row)

{
  pointer piVar1;
  long lVar2;
  const_dbl_view cVar3;
  
  piVar1 = (this->row_ptrs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)piVar1[row];
  cVar3.first = (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar2;
  cVar3.second = piVar1[(long)row + 1] - lVar2;
  return cVar3;
}

Assistant:

const_dbl_view get_values(int row) const {
        return {&values[row_ptrs[row]], row_nnz(row)};
    }